

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2point_index.h
# Opt level: O0

void __thiscall S2PointIndex<int>::Add(S2PointIndex<int> *this,PointData *point_data)

{
  S2Point *p;
  pair<S2CellId,_S2PointIndex<int>::PointData> local_70;
  pair<const_S2CellId,_S2PointIndex<int>::PointData> local_48;
  S2CellId local_20;
  S2CellId id;
  PointData *point_data_local;
  S2PointIndex<int> *this_local;
  
  id.id_ = (uint64)point_data;
  p = PointData::point(point_data);
  S2CellId::S2CellId(&local_20,p);
  std::make_pair<S2CellId&,S2PointIndex<int>::PointData_const&>
            (&local_70,&local_20,(PointData *)id.id_);
  std::pair<const_S2CellId,_S2PointIndex<int>::PointData>::
  pair<S2CellId,_S2PointIndex<int>::PointData,_true>(&local_48,&local_70);
  gtl::internal_btree::
  btree_multiset_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>_>
  ::insert((btree_multiset_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>_>
            *)this,&local_48);
  return;
}

Assistant:

void S2PointIndex<Data>::Add(const PointData& point_data) {
  S2CellId id(point_data.point());
  map_.insert(std::make_pair(id, point_data));
}